

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiID IVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiWindow *window_00;
  ImGuiInputReadMode rm;
  bool bVar7;
  ImVec2 IVar8;
  bool local_6c;
  bool local_6b;
  bool is_repeating_already;
  bool is_double_click_release;
  bool release_anywhere;
  bool release_in;
  int mouse_button;
  bool local_58;
  int local_54;
  bool held;
  bool nav_activated_by_inputs;
  bool nav_activated_by_code;
  bool has_repeated_at_least_once;
  int mouse_button_released;
  int mouse_button_clicked;
  bool hovered;
  bool pressed;
  bool flatten_hovered_children;
  ImGuiWindow *backup_hovered_window;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiButtonFlags flags_local;
  bool *out_held_local;
  bool *out_hovered_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar5 = GImGui;
  window_00 = GetCurrentWindow();
  g._4_4_ = flags;
  if ((flags & 7U) == 0) {
    g._4_4_ = flags | 1;
  }
  if ((g._4_4_ & 0x3f0) == 0) {
    g._4_4_ = g._4_4_ | 0x20;
  }
  pIVar3 = pIVar5->HoveredWindow;
  bVar7 = false;
  if (((g._4_4_ & 0x800) != 0) && (bVar7 = false, pIVar5->HoveredWindow != (ImGuiWindow *)0x0)) {
    bVar7 = pIVar5->HoveredWindow->RootWindowDockTree == window_00->RootWindowDockTree;
  }
  if (bVar7) {
    pIVar5->HoveredWindow = window_00;
  }
  bVar4 = false;
  mouse_button_released._1_1_ = ItemHoverable(bb,id);
  if ((((mouse_button_released._1_1_) && ((pIVar5->DragDropActive & 1U) != 0)) &&
      ((pIVar5->DragDropPayload).SourceId == id)) && ((pIVar5->DragDropSourceFlags & 2U) == 0)) {
    mouse_button_released._1_1_ = false;
  }
  if ((((pIVar5->DragDropActive & 1U) != 0) && ((g._4_4_ & 0x200) != 0)) &&
     (((pIVar5->DragDropSourceFlags & 4U) == 0 && (bVar6 = IsItemHovered(0x80), bVar6)))) {
    mouse_button_released._1_1_ = true;
    SetHoveredID(id);
    if ((pIVar5->HoveredIdTimer - (pIVar5->IO).DeltaTime <= 0.7) && (0.7 <= pIVar5->HoveredIdTimer))
    {
      bVar4 = true;
      pIVar5->DragDropHoldJustPressedId = id;
      FocusWindow(window_00);
    }
  }
  if (bVar7) {
    pIVar5->HoveredWindow = pIVar3;
  }
  if ((((mouse_button_released._1_1_ != false) && ((g._4_4_ & 0x1000) != 0)) &&
      (pIVar5->HoveredIdPreviousFrame != id)) && (pIVar5->HoveredIdPreviousFrame != 0)) {
    mouse_button_released._1_1_ = false;
  }
  if (mouse_button_released._1_1_ != false) {
    if (((g._4_4_ & 0x10000) == 0) ||
       (((((pIVar5->IO).KeyCtrl & 1U) == 0 && (((pIVar5->IO).KeyShift & 1U) == 0)) &&
        (((pIVar5->IO).KeyAlt & 1U) == 0)))) {
      _held = -1;
      local_54 = -1;
      if (((g._4_4_ & 1) == 0) || (((pIVar5->IO).MouseClicked[0] & 1U) == 0)) {
        if (((g._4_4_ & 2) == 0) || (((pIVar5->IO).MouseClicked[1] & 1U) == 0)) {
          if (((g._4_4_ & 4) != 0) && (((pIVar5->IO).MouseClicked[2] & 1U) != 0)) {
            _held = 2;
          }
        }
        else {
          _held = 1;
        }
      }
      else {
        _held = 0;
      }
      if (((g._4_4_ & 1) == 0) || (((pIVar5->IO).MouseReleased[0] & 1U) == 0)) {
        if (((g._4_4_ & 2) == 0) || (((pIVar5->IO).MouseReleased[1] & 1U) == 0)) {
          if (((g._4_4_ & 4) != 0) && (((pIVar5->IO).MouseReleased[2] & 1U) != 0)) {
            local_54 = 2;
          }
        }
        else {
          local_54 = 1;
        }
      }
      else {
        local_54 = 0;
      }
      if ((_held != -1) && (pIVar5->ActiveId != id)) {
        if ((g._4_4_ & 0x60) != 0) {
          SetActiveID(id,window_00);
          pIVar5->ActiveIdMouseButton = _held;
          if ((g._4_4_ & 0x40000) == 0) {
            SetFocusID(id,window_00);
          }
          FocusWindow(window_00);
        }
        if (((g._4_4_ & 0x10) != 0) ||
           (((g._4_4_ & 0x100) != 0 && ((pIVar5->IO).MouseClickedCount[_held] == 2)))) {
          bVar4 = true;
          if ((g._4_4_ & 0x20000) == 0) {
            SetActiveID(id,window_00);
          }
          else {
            ClearActiveID();
          }
          if ((g._4_4_ & 0x40000) == 0) {
            SetFocusID(id,window_00);
          }
          pIVar5->ActiveIdMouseButton = _held;
          FocusWindow(window_00);
        }
      }
      if (((g._4_4_ & 0x80) != 0) && (local_54 != -1)) {
        bVar7 = false;
        if ((g._4_4_ & 0x400) != 0) {
          bVar7 = (pIVar5->IO).KeyRepeatDelay <= (pIVar5->IO).MouseDownDurationPrev[local_54];
        }
        if (!bVar7) {
          bVar4 = true;
        }
        if ((g._4_4_ & 0x40000) == 0) {
          SetFocusID(id,window_00);
        }
        ClearActiveID();
      }
      if ((((pIVar5->ActiveId == id) && ((g._4_4_ & 0x400) != 0)) &&
          (0.0 < (pIVar5->IO).MouseDownDuration[pIVar5->ActiveIdMouseButton])) &&
         (bVar7 = IsMouseClicked(pIVar5->ActiveIdMouseButton,true), bVar7)) {
        bVar4 = true;
      }
    }
    if (bVar4 != false) {
      pIVar5->NavDisableHighlight = true;
    }
  }
  if (((((pIVar5->NavId == id) && ((pIVar5->NavDisableHighlight & 1U) == 0)) &&
       ((pIVar5->NavDisableMouseHover & 1U) != 0)) &&
      (((pIVar5->ActiveId == 0 || (pIVar5->ActiveId == id)) ||
       (pIVar5->ActiveId == window_00->MoveId)))) && ((g._4_4_ & 0x80000) == 0)) {
    mouse_button_released._1_1_ = true;
  }
  if (pIVar5->NavActivateDownId == id) {
    IVar1 = pIVar5->NavActivateId;
    rm = ImGuiInputReadMode_Pressed;
    if ((g._4_4_ & 0x400) != 0) {
      rm = ImGuiInputReadMode_Repeat;
    }
    bVar7 = IsNavInputTest(0,rm);
    if ((IVar1 == id) || (bVar7)) {
      bVar4 = true;
      SetActiveID(id,window_00);
      pIVar5->ActiveIdSource = ImGuiInputSource_Nav;
      if ((g._4_4_ & 0x40000) == 0) {
        SetFocusID(id,window_00);
      }
    }
  }
  local_58 = false;
  if (pIVar5->ActiveId == id) {
    if (pIVar5->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar5->ActiveIdIsJustActivated & 1U) != 0) {
        IVar8 = ::operator-(&(pIVar5->IO).MousePos,&bb->Min);
        pIVar5->ActiveIdClickOffset = IVar8;
      }
      uVar2 = pIVar5->ActiveIdMouseButton;
      local_6b = 4 < uVar2;
      if (local_6b) {
        __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                      ,0x279,
                      "bool ImGui::ButtonBehavior(const ImRect &, ImGuiID, bool *, bool *, ImGuiButtonFlags)"
                     );
      }
      if (((pIVar5->IO).MouseDown[(int)uVar2] & 1U) == 0) {
        local_6c = mouse_button_released._1_1_ != false && (g._4_4_ & 0x20) != 0;
        if (((local_6c) || ((g._4_4_ & 0x40) != 0)) && ((pIVar5->DragDropActive & 1U) == 0)) {
          bVar7 = false;
          if (((g._4_4_ & 0x100) != 0) &&
             (bVar7 = false, ((pIVar5->IO).MouseReleased[(int)uVar2] & 1U) != 0)) {
            bVar7 = (pIVar5->IO).MouseClickedLastCount[(int)uVar2] == 2;
          }
          bVar6 = false;
          if ((g._4_4_ & 0x400) != 0) {
            bVar6 = (pIVar5->IO).KeyRepeatDelay <= (pIVar5->IO).MouseDownDurationPrev[(int)uVar2];
          }
          if ((!bVar7) && (!bVar6)) {
            bVar4 = true;
          }
        }
        ClearActiveID();
      }
      else {
        local_58 = true;
      }
      if ((g._4_4_ & 0x40000) == 0) {
        pIVar5->NavDisableHighlight = true;
      }
    }
    else if ((pIVar5->ActiveIdSource == ImGuiInputSource_Nav) && (pIVar5->NavActivateDownId != id))
    {
      ClearActiveID();
    }
    if (bVar4 != false) {
      pIVar5->ActiveIdHasBeenPressedBefore = true;
    }
  }
  if (out_hovered != (bool *)0x0) {
    *out_hovered = mouse_button_released._1_1_;
  }
  if (out_held != (bool *)0x0) {
    *out_held = local_58;
  }
  return bVar4;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredWindow && g.HoveredWindow->RootWindowDockTree == window->RootWindowDockTree;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && g.LastItemData.ID != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (g.HoveredIdTimer - g.IO.DeltaTime <= DRAGDROP_HOLD_TO_OPEN_TIMER && g.HoveredIdTimer >= DRAGDROP_HOLD_TO_OPEN_TIMER)
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseClickedCount[mouse_button_clicked] == 2))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            pressed = true;
            SetActiveID(id, window);
            g.ActiveIdSource = ImGuiInputSource_Nav;
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseReleased[mouse_button] && g.IO.MouseClickedLastCount[mouse_button] == 2;
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}